

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void dse(gen_ctx_t gen_ctx)

{
  uint uVar1;
  bitmap_t dst;
  MIR_insn_t call_insn;
  int iVar2;
  bb_insn_t_conflict pbVar3;
  size_t len;
  bool local_51;
  bb_t_conflict local_50;
  bb_t_conflict bb;
  bitmap_t live;
  bb_insn_t_conflict prev_bb_insn;
  bb_insn_t_conflict bb_insn;
  ssa_edge_t_conflict se;
  long dead_stores_num;
  uint32_t nloc;
  MIR_insn_t insn;
  gen_ctx_t gen_ctx_local;
  
  se = (ssa_edge_t_conflict)0x0;
  dst = gen_ctx->temp_bitmap;
  calculate_mem_live_info(gen_ctx);
  for (local_50 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); local_50 != (bb_t_conflict)0x0;
      local_50 = DLIST_bb_t_next(local_50)) {
    bitmap_copy(dst,local_50->out);
    pbVar3 = DLIST_bb_insn_t_tail(&local_50->bb_insns);
    while (prev_bb_insn = pbVar3, prev_bb_insn != (bb_insn_t_conflict)0x0) {
      pbVar3 = DLIST_bb_insn_t_prev(prev_bb_insn);
      call_insn = prev_bb_insn->insn;
      iVar2 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&call_insn->field_0x18);
      if (iVar2 != 0) {
        update_call_mem_live(gen_ctx,dst,call_insn);
      }
      iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)&call_insn->field_0x18);
      if (iVar2 != 0) {
        if ((*(ushort *)&call_insn->ops[0].field_0x8 & 0xff) == 0xb) {
          uVar1 = call_insn->ops[0].u.mem.nloc;
          if ((uVar1 != 0) && (iVar2 = bitmap_clear_bit_p(dst,(ulong)uVar1), iVar2 == 0)) {
            if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fprintf((FILE *)gen_ctx->debug_file,"Removing dead store ");
              print_bb_insn(gen_ctx,prev_bb_insn,0);
            }
            ssa_delete_insn(gen_ctx,call_insn);
            se = (ssa_edge_t_conflict)((long)&se->use + 1);
          }
        }
        else if (((ulong)call_insn[1].insn_link.prev & 0xff) == 0xb) {
          if (*(uint *)&call_insn[1].field_0x1c == 0) {
            len = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
            bitmap_set_bit_range_p(dst,1,len);
          }
          else {
            bitmap_set_bit_p(dst,(ulong)*(uint *)&call_insn[1].field_0x1c);
            local_51 = false;
            if (call_insn[1].data != (void *)0x0) {
              local_51 = (*(byte *)(*(long *)((long)call_insn[1].data + 8) + 9) & 2) != 0;
            }
            make_live_from_mem(gen_ctx,(MIR_op_t *)(call_insn + 1),dst,(bitmap_t)0x0,(uint)local_51)
            ;
          }
        }
      }
    }
  }
  if ((gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"%5ld removed dead stores\n",se);
  }
  return;
}

Assistant:

static void dse (gen_ctx_t gen_ctx) {
  MIR_insn_t insn;
  uint32_t nloc;
  long dead_stores_num = 0;
  ssa_edge_t se;
  bb_insn_t bb_insn, prev_bb_insn;
  bitmap_t live = temp_bitmap;

  calculate_mem_live_info (gen_ctx);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_copy (live, bb->mem_live_out);
    for (bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = prev_bb_insn) {
      prev_bb_insn = DLIST_PREV (bb_insn_t, bb_insn);
      insn = bb_insn->insn;
      if (MIR_call_code_p (insn->code)) update_call_mem_live (gen_ctx, live, insn);
      if (!move_code_p (insn->code)) continue;
      if (insn->ops[0].mode == MIR_OP_VAR_MEM) { /* store */
        if ((nloc = insn->ops[0].u.var_mem.nloc) != 0) {
          if (!bitmap_clear_bit_p (live, nloc)) {
            DEBUG (2, {
              fprintf (debug_file, "Removing dead store ");
              print_bb_insn (gen_ctx, bb_insn, FALSE);
            });
            ssa_delete_insn (gen_ctx, insn);
            dead_stores_num++;
          }
        }
      } else if (insn->ops[1].mode == MIR_OP_VAR_MEM) { /* load */
        if ((nloc = insn->ops[1].u.var_mem.nloc) != 0) {
          bitmap_set_bit_p (live, nloc);
          se = insn->ops[1].data;
          make_live_from_mem (gen_ctx, &insn->ops[1], live, NULL,
                              se != NULL && (se->def->alloca_flag & MUST_ALLOCA));
        } else {
          bitmap_set_bit_range_p (live, 1, VARR_LENGTH (mem_attr_t, mem_attrs));
        }
      }
    }
  }
  DEBUG (1, { fprintf (debug_file, "%5ld removed dead stores\n", dead_stores_num); });
}